

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

QMetaType __thiscall QMetaObject::metaType(QMetaObject *this)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  QMetaTypeInterface **ppQVar4;
  QMetaTypeInterface *pQVar5;
  QMetaTypeInterface **ppQVar6;
  QMetaType QVar7;
  uint uVar8;
  QMetaType *pQVar9;
  QByteArrayView typeName;
  QByteArrayView typeName_00;
  
  puVar2 = (this->d).data;
  uVar1 = *puVar2;
  if ((int)uVar1 < 10) {
    puVar3 = (this->d).stringdata;
    typeName.m_size = (ulong)puVar3[(long)(int)puVar2[1] * 2] + (long)puVar3;
    pQVar9 = (QMetaType *)0xffffffffffffffff;
    do {
      ppQVar4 = &pQVar9->d_ptr;
      pQVar9 = (QMetaType *)((long)&pQVar9->d_ptr + 1);
    } while (*(char *)((long)ppQVar4 + typeName.m_size + 1) != '\0');
    typeName.m_data._0_4_ = uVar1;
    typeName.m_data._4_4_ = 0;
    QVar7 = QMetaType::fromName(pQVar9,typeName);
    return (QMetaType)QVar7.d_ptr;
  }
  uVar8 = puVar2[6];
  if (0xb < uVar1) {
    uVar8 = uVar8 + puVar2[8];
  }
  ppQVar4 = (this->d).metaTypes;
  pQVar5 = ppQVar4[(int)uVar8];
  if (pQVar5 != (QMetaTypeInterface *)0x0) {
    QVar7.d_ptr = (QMetaTypeInterface *)0x0;
    if ((pQVar5->typeId)._q_value.super___atomic_base<int>._M_i != 0x2b) {
      QVar7.d_ptr = pQVar5;
    }
    return (QMetaType)QVar7.d_ptr;
  }
  puVar3 = (this->d).stringdata;
  typeName_00.m_size = (ulong)puVar3[(long)(int)puVar2[1] * 2] + (long)puVar3;
  pQVar9 = (QMetaType *)0xffffffffffffffff;
  do {
    ppQVar6 = &pQVar9->d_ptr;
    pQVar9 = (QMetaType *)((long)&pQVar9->d_ptr + 1);
  } while (*(char *)((long)ppQVar6 + typeName_00.m_size + 1) != '\0');
  typeName_00.m_data = (storage_type *)ppQVar4;
  QVar7 = QMetaType::fromName(pQVar9,typeName_00);
  return (QMetaType)QVar7.d_ptr;
}

Assistant:

QMetaType QMetaObject::metaType() const
{

    const QMetaObjectPrivate *d = priv(this->d.data);
    if (d->revision < 10) {
        // before revision 10, we did not store the metatype in the metatype array
        return QMetaType::fromName(className());
    } else {
        /* in the metatype array, we store

         | index                               | data                           |
         |----------------------------------------------------------------------|
         | 0                                   | QMetaType(property0)           |
         | ...                                 | ...                            |
         | propertyCount - 1                   | QMetaType(propertyCount - 1)   |
         | propertyCount                       | QMetaType(enumerator0)         |
         | ...                                 | ...                            |
         | propertyCount + enumeratorCount - 1 | QMetaType(enumeratorCount - 1) |
         | propertyCount + enumeratorCount     | QMetaType(class)               |

        */
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
        // Before revision 12 we only stored metatypes for enums if they showed
        // up as types of properties or method arguments or return values.
        // From revision 12 on, we always store them in a predictable place.
        const qsizetype offset = d->revision < 12
                ? d->propertyCount
                : d->propertyCount + d->enumeratorCount;
#else
        const qsizetype offset = d->propertyCount + d->enumeratorCount;
#endif

        auto iface = this->d.metaTypes[offset];
        if (iface && QtMetaTypePrivate::isInterfaceFor<void>(iface))
            return QMetaType(); // return invalid meta-type for namespaces
        if (iface)
            return QMetaType(iface);
        else // in case of a dynamic metaobject, we might have no metatype stored
            return QMetaType::fromName(className()); // try lookup by name in that case
    }
}